

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O0

FT_Error load_format_20(TT_Face face,FT_Stream stream,FT_ULong post_limit)

{
  uchar *puVar1;
  byte bVar2;
  FT_UShort FVar3;
  FT_UShort FVar4;
  uint uVar5;
  int iVar6;
  uchar *P;
  FT_Memory pFVar7;
  FT_ULong FVar8;
  FT_Pointer pvVar9;
  uint local_7c;
  ushort local_72;
  FT_UShort n_3;
  TT_Post_20 table;
  FT_Int d;
  FT_UInt len;
  int iStack_58;
  FT_UShort n_2;
  FT_Int idx;
  FT_Int n_1;
  FT_Int n;
  FT_Char **name_strings;
  FT_UShort *glyph_indices;
  FT_Error FStack_34;
  FT_UShort num_names;
  FT_Int num_glyphs;
  FT_Error error;
  FT_Memory memory;
  FT_ULong post_limit_local;
  FT_Stream stream_local;
  TT_Face face_local;
  
  _num_glyphs = stream->memory;
  _n_1 = (uchar *)0x0;
  memory = (FT_Memory)post_limit;
  post_limit_local = (FT_ULong)stream;
  stream_local = (FT_Stream)face;
  FVar3 = FT_Stream_ReadUShort(stream,&stack0xffffffffffffffcc);
  uVar5 = (uint)FVar3;
  if (FStack_34 != 0) {
    return FStack_34;
  }
  if (*(ushort *)&stream_local[5].cursor < uVar5) {
    return 3;
  }
  P = (uchar *)ft_mem_realloc(_num_glyphs,2,0,(long)(int)uVar5,(void *)0x0,&stack0xffffffffffffffcc)
  ;
  if ((FStack_34 == 0) &&
     (FStack_34 = FT_Stream_EnterFrame((FT_Stream)post_limit_local,(long)(int)uVar5 << 1),
     FStack_34 == 0)) {
    for (idx = 0; idx < (int)uVar5; idx = idx + 1) {
      FVar4 = FT_Stream_GetUShort((FT_Stream)post_limit_local);
      *(FT_UShort *)(P + (long)idx * 2) = FVar4;
    }
    FT_Stream_ExitFrame((FT_Stream)post_limit_local);
    glyph_indices._6_2_ = 0;
    for (iStack_58 = 0; iStack_58 < (int)uVar5; iStack_58 = iStack_58 + 1) {
      if ((0x101 < *(ushort *)(P + (long)iStack_58 * 2)) &&
         (iVar6 = *(ushort *)(P + (long)iStack_58 * 2) - 0x101,
         (int)(uint)glyph_indices._6_2_ < iVar6)) {
        glyph_indices._6_2_ = (ushort)iVar6;
      }
    }
    _n_1 = (uchar *)ft_mem_realloc(_num_glyphs,8,0,(ulong)glyph_indices._6_2_,(void *)0x0,
                                   &stack0xffffffffffffffcc);
    if (FStack_34 == 0) {
      d._2_2_ = 0;
      while ((d._2_2_ < glyph_indices._6_2_ &&
             (pFVar7 = (FT_Memory)FT_Stream_Pos((FT_Stream)post_limit_local), pFVar7 < memory))) {
        bVar2 = FT_Stream_ReadChar((FT_Stream)post_limit_local,&stack0xffffffffffffffcc);
        table._4_4_ = (uint)bVar2;
        if (FStack_34 != 0) goto LAB_003294a3;
        if ((memory < (FT_Memory)(ulong)table._4_4_) ||
           (FVar8 = FT_Stream_Pos((FT_Stream)post_limit_local),
           (long)memory - (ulong)table._4_4_ < FVar8)) {
          iVar6 = (int)memory;
          FVar8 = FT_Stream_Pos((FT_Stream)post_limit_local);
          local_7c = iVar6 - (int)FVar8;
          if ((int)local_7c < 0) {
            local_7c = 0;
          }
          table._4_4_ = local_7c;
        }
        pvVar9 = ft_mem_realloc(_num_glyphs,1,0,(ulong)(table._4_4_ + 1),(void *)0x0,
                                &stack0xffffffffffffffcc);
        *(FT_Pointer *)(_n_1 + (ulong)d._2_2_ * 8) = pvVar9;
        if ((FStack_34 != 0) ||
           (FStack_34 = FT_Stream_Read((FT_Stream)post_limit_local,
                                       *(FT_Byte **)(_n_1 + (ulong)d._2_2_ * 8),(ulong)table._4_4_),
           FStack_34 != 0)) goto LAB_003294a3;
        *(undefined1 *)(*(long *)(_n_1 + (ulong)d._2_2_ * 8) + (ulong)table._4_4_) = 0;
        d._2_2_ = d._2_2_ + 1;
      }
      if (d._2_2_ < glyph_indices._6_2_) {
        for (; d._2_2_ < glyph_indices._6_2_; d._2_2_ = d._2_2_ + 1) {
          pvVar9 = ft_mem_realloc(_num_glyphs,1,0,1,(void *)0x0,&stack0xffffffffffffffcc);
          *(FT_Pointer *)(_n_1 + (ulong)d._2_2_ * 8) = pvVar9;
          if (FStack_34 != 0) goto LAB_003294a3;
          **(undefined1 **)(_n_1 + (ulong)d._2_2_ * 8) = 0;
        }
      }
      *(FT_UShort *)&stream_local[0xc].cursor = FVar3;
      *(ushort *)((long)&stream_local[0xc].cursor + 2) = glyph_indices._6_2_;
      stream_local[0xc].limit = P;
      stream_local[0xd].base = _n_1;
      return 0;
    }
  }
LAB_003294ee:
  ft_mem_free(_num_glyphs,_n_1);
  ft_mem_free(_num_glyphs,P);
  return FStack_34;
LAB_003294a3:
  for (local_72 = 0; local_72 < glyph_indices._6_2_; local_72 = local_72 + 1) {
    ft_mem_free(_num_glyphs,*(void **)(_n_1 + (ulong)local_72 * 8));
    puVar1 = _n_1 + (ulong)local_72 * 8;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
  }
  goto LAB_003294ee;
}

Assistant:

static FT_Error
  load_format_20( TT_Face    face,
                  FT_Stream  stream,
                  FT_ULong   post_limit )
  {
    FT_Memory   memory = stream->memory;
    FT_Error    error;

    FT_Int      num_glyphs;
    FT_UShort   num_names;

    FT_UShort*  glyph_indices = NULL;
    FT_Char**   name_strings  = NULL;


    if ( FT_READ_USHORT( num_glyphs ) )
      goto Exit;

    /* UNDOCUMENTED!  The number of glyphs in this table can be smaller */
    /* than the value in the maxp table (cf. cyberbit.ttf).             */

    /* There already exist fonts which have more than 32768 glyph names */
    /* in this table, so the test for this threshold has been dropped.  */

    if ( num_glyphs > face->max_profile.numGlyphs )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* load the indices */
    {
      FT_Int  n;


      if ( FT_NEW_ARRAY ( glyph_indices, num_glyphs ) ||
           FT_FRAME_ENTER( num_glyphs * 2L )          )
        goto Fail;

      for ( n = 0; n < num_glyphs; n++ )
        glyph_indices[n] = FT_GET_USHORT();

      FT_FRAME_EXIT();
    }

    /* compute number of names stored in table */
    {
      FT_Int  n;


      num_names = 0;

      for ( n = 0; n < num_glyphs; n++ )
      {
        FT_Int  idx;


        idx = glyph_indices[n];
        if ( idx >= 258 )
        {
          idx -= 257;
          if ( idx > num_names )
            num_names = (FT_UShort)idx;
        }
      }
    }

    /* now load the name strings */
    {
      FT_UShort  n;


      if ( FT_NEW_ARRAY( name_strings, num_names ) )
        goto Fail;

      for ( n = 0; n < num_names; n++ )
      {
        FT_UInt  len;


        if ( FT_STREAM_POS() >= post_limit )
          break;
        else
        {
          FT_TRACE6(( "load_format_20: %d byte left in post table\n",
                      post_limit - FT_STREAM_POS() ));

          if ( FT_READ_BYTE( len ) )
            goto Fail1;
        }

        if ( len > post_limit                   ||
             FT_STREAM_POS() > post_limit - len )
        {
          FT_Int  d = (FT_Int)post_limit - (FT_Int)FT_STREAM_POS();


          FT_ERROR(( "load_format_20:"
                     " exceeding string length (%d),"
                     " truncating at end of post table (%d byte left)\n",
                     len, d ));
          len = (FT_UInt)FT_MAX( 0, d );
        }

        if ( FT_NEW_ARRAY( name_strings[n], len + 1 ) ||
             FT_STREAM_READ( name_strings[n], len   ) )
          goto Fail1;

        name_strings[n][len] = '\0';
      }

      if ( n < num_names )
      {
        FT_ERROR(( "load_format_20:"
                   " all entries in post table are already parsed,"
                   " using NULL names for gid %d - %d\n",
                    n, num_names - 1 ));
        for ( ; n < num_names; n++ )
          if ( FT_NEW_ARRAY( name_strings[n], 1 ) )
            goto Fail1;
          else
            name_strings[n][0] = '\0';
      }
    }

    /* all right, set table fields and exit successfully */
    {
      TT_Post_20  table = &face->postscript_names.names.format_20;


      table->num_glyphs    = (FT_UShort)num_glyphs;
      table->num_names     = (FT_UShort)num_names;
      table->glyph_indices = glyph_indices;
      table->glyph_names   = name_strings;
    }
    return FT_Err_Ok;

  Fail1:
    {
      FT_UShort  n;


      for ( n = 0; n < num_names; n++ )
        FT_FREE( name_strings[n] );
    }

  Fail:
    FT_FREE( name_strings );
    FT_FREE( glyph_indices );

  Exit:
    return error;
  }